

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O3

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayAlter(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  pointer pCVar2;
  pointer pCVar3;
  bool bVar4;
  int iVar5;
  AlterInfo *this_00;
  pointer this_01;
  UniqueConstraint *this_02;
  ColumnList *this_03;
  ColumnList *pCVar6;
  ColumnDefinition *pCVar7;
  LogicalType *__x;
  string *__x_00;
  Binder *pBVar8;
  type binder_00;
  DataTable *this_04;
  DataTableInfo *pDVar9;
  DatabaseInstance *pDVar10;
  IndexTypeSet *this_05;
  element_type *peVar11;
  pointer pLVar12;
  ColumnIndex *column_index;
  pointer pCVar13;
  ColumnListIterator CVar14;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> ptr;
  vector<unsigned_long,_true> column_ids;
  undefined1 local_280 [48];
  optional_ptr<duckdb::IndexType,_true> index_type;
  shared_ptr<duckdb::Binder,_true> binder;
  vector<duckdb::ColumnIndex,_true> column_indexes;
  CreateIndexInput input;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  unbound_expressions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  vector<duckdb::LogicalType,_true> column_types;
  vector<duckdb::LogicalIndex,_true> logical_indexes;
  IndexBinder idx_binder;
  IndexStorageInfo index_storage_info;
  undefined4 extraout_var;
  
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(deserializer,0x65,"info");
  ptr.super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
  super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
       (__uniq_ptr_data<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true,_true>)0x0;
  iVar5 = (*(this->deserializer).super_Deserializer._vptr_Deserializer[10])(deserializer);
  if ((char)iVar5 != '\0') {
    (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
    ParseInfo::Deserialize((ParseInfo *)&index_storage_info,&deserializer->super_Deserializer);
    ptr.super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
    super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         index_storage_info.name._M_dataplus._M_p;
    (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  }
  (*(deserializer->super_Deserializer)._vptr_Deserializer[0xb])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  this_00 = (AlterInfo *)
            unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::operator->
                      (&ptr);
  bVar4 = AlterInfo::IsAddPrimaryKey(this_00);
  if (bVar4) {
    (*(deserializer->super_Deserializer)._vptr_Deserializer[2])
              (deserializer,0x66,"index_storage_info");
    (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
    IndexStorageInfo::Deserialize(&index_storage_info,&deserializer->super_Deserializer);
    (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
    (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
    ReplayIndexData(this->db,deserializer,&index_storage_info,this->deserialize_only);
    if (this->deserialize_only == false) {
      this_01 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                            *)(this_00 + 1));
      this_02 = Constraint::Cast<duckdb::UniqueConstraint>(this_01);
      idx_binder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)
           Catalog::GetEntry<duckdb::TableCatalogEntry>
                     (this->catalog,this->context,&this_00->schema,&this_00->name,THROW_EXCEPTION,
                      (QueryErrorContext)0xffffffffffffffff);
      optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::TableCatalogEntry,_true> *)&idx_binder);
      local_280._32_8_ = idx_binder.super_ExpressionBinder._vptr_ExpressionBinder;
      this_03 = TableCatalogEntry::GetColumns
                          ((TableCatalogEntry *)
                           idx_binder.super_ExpressionBinder._vptr_ExpressionBinder);
      Binder::CreateBinder
                ((Binder *)&binder,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,
                 REGULAR_BINDER);
      column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      CVar14 = ColumnList::Logical(this_03);
      pCVar6 = CVar14.list;
      if (((undefined1  [16])CVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pCVar2 = (pCVar6->columns).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (((long)pCVar2 -
               (long)(pCVar6->columns).
                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     .
                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
        peVar11 = (element_type *)
                  (((long)pCVar2 -
                    (long)(pCVar6->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      }
      else {
        peVar11 = (element_type *)
                  ((long)(pCVar6->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar6->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
        idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar11;
      }
      idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      idx_binder.super_ExpressionBinder.target_type.id_ = CVar14.physical;
      idx_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)pCVar6;
      while (((idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               peVar11 ||
              ((element_type *)
               idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != peVar11)) ||
             ((ColumnList *)idx_binder.super_ExpressionBinder._vptr_ExpressionBinder != pCVar6))) {
        pCVar7 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                           ((ColumnLogicalIteratorInternal *)&idx_binder);
        __x = ColumnDefinition::Type(pCVar7);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   &column_types,__x);
        __x_00 = ColumnDefinition::Name_abi_cxx11_(pCVar7);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&column_names,__x_00);
        idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             ((long)&(idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->_vptr_ExtraTypeInfo + 1);
      }
      column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
      psVar1 = &idx_binder.super_ExpressionBinder.target_type.type_info_;
      idx_binder.super_ExpressionBinder.target_type.id_ = INVALID;
      idx_binder.super_ExpressionBinder.target_type.physical_type_ = ~INVALID;
      idx_binder.super_ExpressionBinder.target_type._2_6_ = 0;
      idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((ulong)idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
           0xffffffffffffff00);
      idx_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)psVar1;
      BindContext::AddBaseTable
                (&pBVar8->bind_context,0,(string *)&idx_binder,&column_names,&column_types,
                 &column_indexes,(TableCatalogEntry *)local_280._32_8_,true);
      if ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
          idx_binder.super_ExpressionBinder._vptr_ExpressionBinder != psVar1) {
        operator_delete(idx_binder.super_ExpressionBinder._vptr_ExpressionBinder);
      }
      binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&binder);
      IndexBinder::IndexBinder
                (&idx_binder,binder_00,this->context,
                 (optional_ptr<duckdb::TableCatalogEntry,_true>)0x0,
                 (optional_ptr<duckdb::CreateIndexInfo,_true>)0x0);
      unbound_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unbound_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unbound_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      UniqueConstraint::GetLogicalIndexes(&logical_indexes,this_02,this_03);
      if (logical_indexes.super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
          super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Vector_impl_data._M_start !=
          logical_indexes.super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
          super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pLVar12 = logical_indexes.
                  super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                  super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          pCVar7 = ColumnList::GetColumn(this_03,(LogicalIndex)pLVar12->index);
          ColumnDefinition::GetName_abi_cxx11_((string *)&input,pCVar7);
          make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string,std::__cxx11::string&>
                    ((duckdb *)&column_ids,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                     &this_00->name);
          local_280._0_8_ =
               column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          if (input.table_io_manager != (TableIOManager *)&input.constraint_type) {
            operator_delete(input.table_io_manager);
          }
          ExpressionBinder::Bind
                    ((ExpressionBinder *)&input,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&idx_binder,(LogicalType *)local_280,false);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&unbound_expressions,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&input);
          if (input.table_io_manager != (TableIOManager *)0x0) {
            (*(input.table_io_manager)->_vptr_TableIOManager[1])();
          }
          if ((pointer)local_280._0_8_ != (pointer)0x0) {
            (**(code **)(*(unsigned_long *)local_280._0_8_ + 8))();
          }
          pLVar12 = pLVar12 + 1;
        } while (pLVar12 !=
                 logical_indexes.
                 super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      pCVar3 = column_indexes.
               super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_finish;
      column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_start !=
          column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pCVar13 = column_indexes.
                  super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          input.table_io_manager = (TableIOManager *)pCVar13->index;
          if (column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids,
                       (iterator)
                       column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(unsigned_long *)&input);
          }
          else {
            *column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)input.table_io_manager;
            column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pCVar13 = pCVar13 + 1;
        } while (pCVar13 != pCVar3);
      }
      iVar5 = (*(((StandardEntry *)local_280._32_8_)->super_InCatalogEntry).super_CatalogEntry.
                _vptr_CatalogEntry[0x10])();
      this_04 = (DataTable *)CONCAT44(extraout_var,iVar5);
      pDVar9 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this_04->info);
      input.table_io_manager =
           shared_ptr<duckdb::TableIOManager,_true>::operator*(&pDVar9->table_io_manager);
      input.db = this_04->db;
      input.options = &index_storage_info.options;
      input.constraint_type = PRIMARY;
      input.column_ids = &column_ids;
      input.unbound_expressions = &unbound_expressions;
      input.name = &index_storage_info.name;
      input.storage_info = &index_storage_info;
      pDVar10 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->context->db);
      this_05 = DBConfig::GetIndexTypes(&pDVar10->config);
      local_280._0_8_ = local_280 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"ART","");
      index_type = IndexTypeSet::FindByName(this_05,(string *)local_280);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_);
      }
      optional_ptr<duckdb::IndexType,_true>::CheckValid(&index_type);
      (*(index_type.ptr)->create_instance)((CreateIndexInput *)local_280);
      local_280._40_8_ = local_280._0_8_;
      local_280._0_8_ = (pointer)0x0;
      DataTable::AddIndex(this_04,(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>
                                   *)(local_280 + 0x28));
      if ((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           *)local_280._40_8_ !=
          (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           *)0x0) {
        (*(code *)(((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)local_280._40_8_)->
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[1].
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                  _M_t)();
      }
      Catalog::Alter(this->catalog,this->context,this_00);
      if ((pointer)local_280._0_8_ != (pointer)0x0) {
        (**(code **)(*(unsigned_long *)local_280._0_8_ + 8))();
      }
      if (column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (logical_indexes.super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
          super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(logical_indexes.
                        super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                        super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&unbound_expressions);
      ExpressionBinder::~ExpressionBinder(&idx_binder.super_ExpressionBinder);
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                (&column_indexes.
                  super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&column_names);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&column_types)
      ;
      if (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    ::std::
    vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
    ::~vector(&index_storage_info.buffers.
               super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
             );
    ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
    ~vector(&index_storage_info.allocator_infos.
             super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
           );
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&index_storage_info.options._M_h);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)index_storage_info.name._M_dataplus._M_p != &index_storage_info.name.field_2) {
      operator_delete(index_storage_info.name._M_dataplus._M_p);
    }
  }
  else if (this->deserialize_only == false) {
    Catalog::Alter(this->catalog,this->context,this_00);
  }
  if (ptr.super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
      super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true,_true>)0x0) {
    (**(code **)(*(long *)ptr.
                          super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>
                          .super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayAlter() {
	auto info = deserializer.ReadProperty<unique_ptr<ParseInfo>>(101, "info");
	auto &alter_info = info->Cast<AlterInfo>();
	if (!alter_info.IsAddPrimaryKey()) {
		return ReplayWithoutIndex(context, catalog, alter_info, DeserializeOnly());
	}

	auto index_storage_info = deserializer.ReadProperty<IndexStorageInfo>(102, "index_storage_info");
	ReplayIndexData(db, deserializer, index_storage_info, DeserializeOnly());
	if (DeserializeOnly()) {
		return;
	}

	auto &table_info = alter_info.Cast<AlterTableInfo>();
	auto &constraint_info = table_info.Cast<AddConstraintInfo>();
	auto &unique_info = constraint_info.constraint->Cast<UniqueConstraint>();

	auto &table =
	    catalog.GetEntry<TableCatalogEntry>(context, table_info.schema, table_info.name).Cast<DuckTableEntry>();
	auto &column_list = table.GetColumns();

	// Add the table to the bind context to bind the parsed expressions.
	auto binder = Binder::CreateBinder(context);
	vector<LogicalType> column_types;
	vector<string> column_names;
	for (auto &col : column_list.Logical()) {
		column_types.push_back(col.Type());
		column_names.push_back(col.Name());
	}

	// Create a binder to bind the parsed expressions.
	vector<ColumnIndex> column_indexes;
	binder->bind_context.AddBaseTable(0, string(), column_names, column_types, column_indexes, table);
	IndexBinder idx_binder(*binder, context);

	// Bind the parsed expressions to create unbound expressions.
	vector<unique_ptr<Expression>> unbound_expressions;
	auto logical_indexes = unique_info.GetLogicalIndexes(column_list);
	for (const auto &logical_index : logical_indexes) {
		auto &col = column_list.GetColumn(logical_index);
		unique_ptr<ParsedExpression> parsed = make_uniq<ColumnRefExpression>(col.GetName(), table_info.name);
		unbound_expressions.push_back(idx_binder.Bind(parsed));
	}

	vector<column_t> column_ids;
	for (auto &column_index : column_indexes) {
		column_ids.push_back(column_index.GetPrimaryIndex());
	}

	auto &storage = table.GetStorage();
	CreateIndexInput input(TableIOManager::Get(storage), storage.db, IndexConstraintType::PRIMARY,
	                       index_storage_info.name, column_ids, unbound_expressions, index_storage_info,
	                       index_storage_info.options);

	auto index_type = context.db->config.GetIndexTypes().FindByName(ART::TYPE_NAME);
	auto index_instance = index_type->create_instance(input);
	storage.AddIndex(std::move(index_instance));

	catalog.Alter(context, alter_info);
}